

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O1

void __thiscall
dynamicgraph::
Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::set
          (Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *this,istringstream *stringValue)

{
  long *local_30 [2];
  long local_20 [2];
  
  std::__cxx11::stringbuf::str();
  (*(this->super_SignalBase<int>)._vptr_SignalBase[0x1f])(this,local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return;
}

Assistant:

void Signal<T, Time>::set(std::istringstream &stringValue) {
  (*this) = signal_io<T>::cast(stringValue);
}